

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O3

void __thiscall
cbtAlignedObjectArray<cbtAlignedObjectArray<const_cbtDbvtNode_*>_>::resize
          (cbtAlignedObjectArray<cbtAlignedObjectArray<const_cbtDbvtNode_*>_> *this,int newsize,
          cbtAlignedObjectArray<const_cbtDbvtNode_*> *fillData)

{
  uint uVar1;
  uint uVar2;
  cbtAlignedObjectArray<const_cbtDbvtNode_*> *pcVar3;
  int iVar4;
  long lVar5;
  
  uVar1 = this->m_size;
  iVar4 = uVar1 - newsize;
  if (iVar4 == 0 || (int)uVar1 < newsize) {
    if ((int)uVar1 < newsize) {
      if (this->m_capacity < newsize) {
        if (newsize == 0) {
          pcVar3 = (cbtAlignedObjectArray<const_cbtDbvtNode_*> *)0x0;
          uVar2 = uVar1;
        }
        else {
          pcVar3 = (cbtAlignedObjectArray<const_cbtDbvtNode_*> *)
                   cbtAlignedAllocInternal((long)newsize << 5,0x10);
          uVar2 = this->m_size;
        }
        if (0 < (int)uVar2) {
          lVar5 = 0;
          do {
            cbtAlignedObjectArray<const_cbtDbvtNode_*>::cbtAlignedObjectArray
                      ((cbtAlignedObjectArray<const_cbtDbvtNode_*> *)
                       ((long)&pcVar3->field_0x0 + lVar5),
                       (cbtAlignedObjectArray<const_cbtDbvtNode_*> *)
                       (&this->m_data->field_0x0 + lVar5));
            lVar5 = lVar5 + 0x20;
          } while ((ulong)uVar2 << 5 != lVar5);
          iVar4 = this->m_size;
          if (0 < (long)iVar4) {
            lVar5 = 0;
            do {
              cbtAlignedObjectArray<const_cbtDbvtNode_*>::~cbtAlignedObjectArray
                        ((cbtAlignedObjectArray<const_cbtDbvtNode_*> *)
                         (&this->m_data->field_0x0 + lVar5));
              lVar5 = lVar5 + 0x20;
            } while ((long)iVar4 * 0x20 != lVar5);
          }
        }
        if ((this->m_data != (cbtAlignedObjectArray<const_cbtDbvtNode_*> *)0x0) &&
           (this->m_ownsMemory == true)) {
          cbtAlignedFreeInternal(this->m_data);
        }
        this->m_ownsMemory = true;
        this->m_data = pcVar3;
        this->m_capacity = newsize;
        if (newsize <= (int)uVar1) goto LAB_008a5453;
      }
      iVar4 = newsize - uVar1;
      lVar5 = (long)(int)uVar1 << 5;
      do {
        cbtAlignedObjectArray<const_cbtDbvtNode_*>::cbtAlignedObjectArray
                  ((cbtAlignedObjectArray<const_cbtDbvtNode_*> *)(&this->m_data->field_0x0 + lVar5),
                   fillData);
        lVar5 = lVar5 + 0x20;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
  }
  else {
    lVar5 = (long)newsize << 5;
    do {
      cbtAlignedObjectArray<const_cbtDbvtNode_*>::~cbtAlignedObjectArray
                ((cbtAlignedObjectArray<const_cbtDbvtNode_*> *)(&this->m_data->field_0x0 + lVar5));
      lVar5 = lVar5 + 0x20;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
LAB_008a5453:
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE void resize(int newsize, const T& fillData = T())
	{
		const int curSize = size();

		if (newsize < curSize)
		{
			for (int i = newsize; i < curSize; i++)
			{
				m_data[i].~T();
			}
		}
		else
		{
			if (newsize > curSize)
			{
				reserve(newsize);
			}
#ifdef BT_USE_PLACEMENT_NEW
			for (int i = curSize; i < newsize; i++)
			{
				new (&m_data[i]) T(fillData);
			}
#endif  //BT_USE_PLACEMENT_NEW
		}

		m_size = newsize;
	}